

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_list.cpp
# Opt level: O2

void __thiscall ImageList::ImageList(ImageList *this,QSize maxImageSize,QWidget *parent)

{
  ImageListPrivate *this_00;
  
  QtMWidgets::AbstractListView<QImage>::AbstractListView
            (&this->super_AbstractListView<QImage>,parent);
  *(undefined ***)
   &(this->super_AbstractListView<QImage>).super_AbstractListViewBase.super_AbstractScrollArea =
       &PTR_metaObject_001b8a08;
  *(undefined ***)
   &(this->super_AbstractListView<QImage>).super_AbstractListViewBase.super_AbstractScrollArea.
    field_0x10 = &PTR__ImageList_001b8c18;
  this_00 = (ImageListPrivate *)operator_new(0x18);
  this_00->q = this;
  this_00->borderWidth = 5;
  (this_00->maxImageSize).wd = maxImageSize.wd + -10;
  (this_00->maxImageSize).ht = maxImageSize.ht + -10;
  (this->d).d = this_00;
  ImageListPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

ImageList::ImageList( const QSize maxImageSize, QWidget * parent )
	:	QtMWidgets::AbstractListView< QImage > ( parent )
	,	d( new ImageListPrivate( maxImageSize, this ) )
{
	d->init();
}